

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O1

void vkt::ubo::anon_unknown_0::generateCompareSrc
               (ostringstream *src,char *resultVar,ShaderInterface *interface,UniformLayout *layout,
               map<int,_void_*,_std::less<int>,_std::allocator<std::pair<const_int,_void_*>_>_>
               *blockPointers,bool isVertex,MatrixLoadFlags matrixLoadFlag)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  size_type sVar2;
  pointer pSVar3;
  pointer piVar4;
  int iVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  size_type *psVar9;
  SharedPtrStateBase **ppSVar10;
  pointer pBVar11;
  int iVar12;
  uint uVar13;
  UniformLayout *layout_00;
  pointer pBVar14;
  ulong uVar15;
  byte bVar16;
  undefined7 in_register_00000089;
  pointer pBVar17;
  pointer pcVar18;
  char *pcVar19;
  uint uVar20;
  MatrixLoadFlags matrixLoadFlag_00;
  int local_320;
  string instancePostfix;
  string apiPrefix;
  string srcPrefix;
  long *local_2a0;
  undefined8 local_298;
  long local_290;
  undefined8 uStack_288;
  ulong *local_280;
  long local_278;
  ulong local_270 [2];
  ulong *local_260;
  long local_258;
  ulong local_250 [2];
  UniformLayout *local_240;
  ShaderInterface *local_238;
  char *local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_228;
  pointer local_220;
  ostringstream *local_218;
  undefined8 local_210;
  string srcName;
  string apiName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string blockInstanceName;
  ios_base local_138 [264];
  
  local_210 = CONCAT71(in_register_00000089,isVertex);
  lVar6 = *(long *)(resultVar + 0x18);
  if (0 < (int)((ulong)(*(long *)(resultVar + 0x20) - lVar6) >> 4)) {
    bVar16 = (byte)blockPointers ^ 1;
    uVar20 = (uint)bVar16 * 0x800 + 0x800;
    pBVar17 = (pointer)&(layout->blocks).
                        super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    layout_00 = (UniformLayout *)0x0;
    local_240 = layout;
    local_238 = interface;
    local_230 = resultVar;
    local_220 = pBVar17;
    local_218 = src;
    do {
      __lhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               (lVar6 + (long)layout_00 * 0x10);
      if ((*(uint *)((long)&__lhs[2].field_2 + 0xc) & (uint)bVar16 * 0x200 + 0x200) != 0) {
        sVar2 = __lhs[1]._M_string_length;
        iVar1 = *(int *)((long)&__lhs[2].field_2 + 8);
        iVar12 = 1;
        if (1 < iVar1) {
          iVar12 = iVar1;
        }
        apiPrefix._M_dataplus._M_p = (pointer)&apiPrefix.field_2;
        if (sVar2 == 0) {
          std::__cxx11::string::_M_construct<char_const*>((string *)&apiPrefix,"");
        }
        else {
          pcVar18 = (__lhs->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&apiPrefix,pcVar18,pcVar18 + __lhs->_M_string_length);
          std::__cxx11::string::append((char *)&apiPrefix);
        }
        local_228 = __lhs + 1;
        if (iVar1 < 1) {
          iVar12 = 1;
        }
        local_320 = 0;
        do {
          if (iVar1 < 1) {
            instancePostfix._M_dataplus._M_p = (pointer)&instancePostfix.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&instancePostfix,"");
          }
          else {
            local_280 = local_270;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"[","");
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&blockInstanceName);
            std::ostream::operator<<(&blockInstanceName,local_320);
            std::__cxx11::stringbuf::str();
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&blockInstanceName);
            std::ios_base::~ios_base(local_138);
            uVar15 = 0xf;
            if (local_280 != local_270) {
              uVar15 = local_270[0];
            }
            if (uVar15 < (ulong)(local_258 + local_278)) {
              uVar15 = 0xf;
              if (local_260 != local_250) {
                uVar15 = local_250[0];
              }
              if (uVar15 < (ulong)(local_258 + local_278)) goto LAB_00691510;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_260,0,(char *)0x0,(ulong)local_280);
            }
            else {
LAB_00691510:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append((char *)&local_280,(ulong)local_260);
            }
            plVar8 = puVar7 + 2;
            if ((long *)*puVar7 == plVar8) {
              local_290 = *plVar8;
              uStack_288 = puVar7[3];
              local_2a0 = &local_290;
            }
            else {
              local_290 = *plVar8;
              local_2a0 = (long *)*puVar7;
            }
            local_298 = puVar7[1];
            *puVar7 = plVar8;
            puVar7[1] = 0;
            *(undefined1 *)plVar8 = 0;
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_2a0);
            instancePostfix._M_dataplus._M_p = (pointer)&instancePostfix.field_2;
            psVar9 = (size_type *)(plVar8 + 2);
            if ((size_type *)*plVar8 == psVar9) {
              instancePostfix.field_2._M_allocated_capacity = *psVar9;
              instancePostfix.field_2._8_8_ = plVar8[3];
            }
            else {
              instancePostfix.field_2._M_allocated_capacity = *psVar9;
              instancePostfix._M_dataplus._M_p = (pointer)*plVar8;
            }
            instancePostfix._M_string_length = plVar8[1];
            *plVar8 = (long)psVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
          }
          if (0 < iVar1) {
            if (local_2a0 != &local_290) {
              operator_delete(local_2a0,local_290 + 1);
            }
            if (local_260 != local_250) {
              operator_delete(local_260,local_250[0] + 1);
            }
            if (local_280 != local_270) {
              operator_delete(local_280,local_270[0] + 1);
            }
          }
          std::operator+(&blockInstanceName,__lhs,&instancePostfix);
          if (sVar2 == 0) {
            srcPrefix._M_dataplus._M_p = (pointer)&srcPrefix.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&srcPrefix);
          }
          else {
            std::operator+(&local_1c8,local_228,&instancePostfix);
            plVar8 = (long *)std::__cxx11::string::append((char *)&local_1c8);
            srcPrefix._M_dataplus._M_p = (pointer)&srcPrefix.field_2;
            psVar9 = (size_type *)(plVar8 + 2);
            if ((size_type *)*plVar8 == psVar9) {
              srcPrefix.field_2._M_allocated_capacity = *psVar9;
              srcPrefix.field_2._8_8_ = plVar8[3];
            }
            else {
              srcPrefix.field_2._M_allocated_capacity = *psVar9;
              srcPrefix._M_dataplus._M_p = (pointer)*plVar8;
            }
            srcPrefix._M_string_length = plVar8[1];
            *plVar8 = (long)psVar9;
            plVar8[1] = 0;
            *(undefined1 *)(plVar8 + 2) = 0;
          }
          if ((sVar2 != 0) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2)) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          pSVar3 = (local_238->m_structs).
                   super__Vector_base<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar13 = (int)((long)(local_238->m_structs).
                               super__Vector_base<de::SharedPtr<vkt::ubo::StructType>,_std::allocator<de::SharedPtr<vkt::ubo::StructType>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 4) *
                   -0x33333333;
          iVar5 = -1;
          if (0 < (int)uVar13) {
            ppSVar10 = &pSVar3[4].m_state;
            uVar15 = 0;
            do {
              if ((layout_00 ==
                   (UniformLayout *)
                   (ulong)*(uint *)&((SharedPtr<vkt::ubo::StructType> *)(ppSVar10 + -1))->m_ptr) &&
                 (*(int *)ppSVar10 == local_320)) {
                iVar5 = (int)uVar15;
                break;
              }
              uVar15 = uVar15 + 1;
              ppSVar10 = ppSVar10 + 10;
            } while ((uVar13 & 0x7fffffff) != uVar15);
          }
          pBVar11 = pBVar17;
          for (pBVar14 = (local_240->blocks).
                         super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage; pBVar14 != (pointer)0x0
              ; pBVar14 = *(pointer *)
                           ((long)&(pBVar14->name).field_2 + (ulong)(pBVar14->size < iVar5) * 8)) {
            if (iVar5 <= pBVar14->size) {
              pBVar11 = pBVar14;
            }
          }
          pBVar14 = pBVar17;
          if ((pBVar11 != pBVar17) && (pBVar14 = pBVar11, iVar5 < pBVar11->size)) {
            pBVar14 = pBVar17;
          }
          pcVar18 = __lhs[2]._M_dataplus._M_p;
          if (pcVar18 != (pointer)__lhs[2]._M_string_length) {
            piVar4 = (pBVar14->activeUniformIndices).super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pcVar18 = pcVar18 + 0x20;
            do {
              if ((*(uint *)(pcVar18 + 0x18) & uVar20) == 0) {
                std::operator+(&srcName,&srcPrefix,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (pcVar18 + -0x20));
                matrixLoadFlag_00 = 0x691836;
                std::operator+(&apiName,&apiPrefix,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               (pcVar18 + -0x20));
                generateCompareSrc(local_218,pcVar18,(VarType *)&srcName,&apiName,
                                   (string *)local_238,layout_00,(int)piVar4,(void *)(ulong)uVar20,
                                   (deUint32)local_210,matrixLoadFlag_00);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)apiName._M_dataplus._M_p != &apiName.field_2) {
                  operator_delete(apiName._M_dataplus._M_p,apiName.field_2._M_allocated_capacity + 1
                                 );
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)srcName._M_dataplus._M_p != &srcName.field_2) {
                  operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1
                                 );
                }
              }
              pcVar19 = pcVar18 + 0x20;
              pcVar18 = pcVar18 + 0x40;
            } while (pcVar19 != (char *)__lhs[2]._M_string_length);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)srcPrefix._M_dataplus._M_p != &srcPrefix.field_2) {
            operator_delete(srcPrefix._M_dataplus._M_p,srcPrefix.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)blockInstanceName._M_dataplus._M_p != &blockInstanceName.field_2) {
            operator_delete(blockInstanceName._M_dataplus._M_p,
                            blockInstanceName.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)instancePostfix._M_dataplus._M_p != &instancePostfix.field_2) {
            operator_delete(instancePostfix._M_dataplus._M_p,
                            instancePostfix.field_2._M_allocated_capacity + 1);
          }
          pBVar17 = local_220;
          local_320 = local_320 + 1;
        } while (local_320 != iVar12);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)apiPrefix._M_dataplus._M_p != &apiPrefix.field_2) {
          operator_delete(apiPrefix._M_dataplus._M_p,apiPrefix.field_2._M_allocated_capacity + 1);
        }
      }
      layout_00 = (UniformLayout *)
                  ((long)&(layout_00->blocks).
                          super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
      lVar6 = *(long *)(local_230 + 0x18);
    } while ((long)layout_00 < (long)(int)((ulong)(*(long *)(local_230 + 0x20) - lVar6) >> 4));
  }
  return;
}

Assistant:

void generateCompareSrc (std::ostringstream& src,
						 const char* resultVar,
						 const ShaderInterface& interface,
						 const UniformLayout& layout,
						 const std::map<int,
						 void*>& blockPointers,
						 bool isVertex,
						 MatrixLoadFlags matrixLoadFlag)
{
	deUint32 unusedMask = isVertex ? UNUSED_VERTEX : UNUSED_FRAGMENT;

	for (int blockNdx = 0; blockNdx < interface.getNumUniformBlocks(); blockNdx++)
	{
		const UniformBlock& block = interface.getUniformBlock(blockNdx);

		if ((block.getFlags() & (isVertex ? DECLARE_VERTEX : DECLARE_FRAGMENT)) == 0)
			continue; // Skip.

		bool			hasInstanceName	= block.hasInstanceName();
		bool			isArray			= block.isArray();
		int				numInstances	= isArray ? block.getArraySize() : 1;
		std::string		apiPrefix		= hasInstanceName ? block.getBlockName() + "." : std::string("");

		DE_ASSERT(!isArray || hasInstanceName);

		for (int instanceNdx = 0; instanceNdx < numInstances; instanceNdx++)
		{
			std::string		instancePostfix		= isArray ? std::string("[") + de::toString(instanceNdx) + "]" : std::string("");
			std::string		blockInstanceName	= block.getBlockName() + instancePostfix;
			std::string		srcPrefix			= hasInstanceName ? block.getInstanceName() + instancePostfix + "." : std::string("");
			int				blockLayoutNdx		= layout.getBlockLayoutIndex(blockNdx, instanceNdx);
			void*			basePtr				= blockPointers.find(blockLayoutNdx)->second;

			for (UniformBlock::ConstIterator uniformIter = block.begin(); uniformIter != block.end(); uniformIter++)
			{
				const Uniform& uniform = *uniformIter;

				if (uniform.getFlags() & unusedMask)
					continue; // Don't read from that uniform.

				std::string srcName = srcPrefix + uniform.getName();
				std::string apiName = apiPrefix + uniform.getName();
				generateCompareSrc(src, resultVar, uniform.getType(), srcName, apiName, layout, blockNdx, basePtr, unusedMask, matrixLoadFlag);
			}
		}
	}
}